

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O0

ssize_t __thiscall
de::BlockBuffer<unsigned_char>::write
          (BlockBuffer<unsigned_char> *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  BufferCanceledException *this_00;
  ssize_t extraout_RAX;
  int local_30;
  int numWritten;
  uchar *elements_local;
  int numElements_local;
  BlockBuffer<unsigned_char> *this_local;
  
  if (this->m_canceled != 0) {
    this_00 = (BufferCanceledException *)__cxa_allocate_exception(8);
    BufferCanceledException::BufferCanceledException(this_00);
    __cxa_throw(this_00,&BufferCanceledException::typeinfo,
                BufferCanceledException::~BufferCanceledException);
  }
  Mutex::lock(&this->m_writeLock);
  for (local_30 = 0; local_30 < __fd; local_30 = iVar1 + local_30) {
    iVar1 = writeToCurrentBlock(this,__fd - local_30,(uchar *)((long)__buf + (long)local_30),true);
  }
  Mutex::unlock(&this->m_writeLock);
  return extraout_RAX;
}

Assistant:

void BlockBuffer<T>::write (int numElements, const T* elements)
{
	DE_ASSERT(numElements > 0 && elements != DE_NULL);

	if (m_canceled)
		throw CanceledException();

	m_writeLock.lock();

	int numWritten = 0;
	while (numWritten < numElements)
		numWritten += writeToCurrentBlock(numElements-numWritten, elements+numWritten, true /* blocking */);

	m_writeLock.unlock();
}